

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

int curl_formget(curl_httppost *form,void *arg,curl_formget_callback append)

{
  size_t sVar1;
  size_t sVar2;
  size_t nread;
  char buffer [8192];
  undefined1 local_1f0 [8];
  curl_mimepart toppart;
  CURLcode result;
  curl_formget_callback append_local;
  void *arg_local;
  curl_httppost *form_local;
  
  Curl_mime_initpart((curl_mimepart *)local_1f0,(Curl_easy *)0x0);
  toppart.lastreadstatus._4_4_ =
       Curl_getformdata((Curl_easy *)0x0,(curl_mimepart *)local_1f0,form,(curl_read_callback)0x0);
  if (toppart.lastreadstatus._4_4_ == CURLE_OK) {
    toppart.lastreadstatus._4_4_ =
         Curl_mime_prepare_headers
                   ((curl_mimepart *)local_1f0,"multipart/form-data",(char *)0x0,MIMESTRATEGY_FORM);
  }
  while ((toppart.lastreadstatus._4_4_ == CURLE_OK &&
         (sVar1 = Curl_mime_read((char *)&nread,1,0x2000,local_1f0), sVar1 != 0))) {
    if (((0x2000 < sVar1) || (sVar2 = (*append)(arg,(char *)&nread,sVar1), sVar2 != sVar1)) &&
       (toppart.lastreadstatus._4_4_ = CURLE_READ_ERROR, sVar1 == 0x10000000)) {
      toppart.lastreadstatus._4_4_ = CURLE_ABORTED_BY_CALLBACK;
    }
  }
  Curl_mime_cleanpart((curl_mimepart *)local_1f0);
  return toppart.lastreadstatus._4_4_;
}

Assistant:

int curl_formget(struct curl_httppost *form, void *arg,
                 curl_formget_callback append)
{
  CURLcode result;
  curl_mimepart toppart;

  Curl_mime_initpart(&toppart, NULL); /* default form is empty */
  result = Curl_getformdata(NULL, &toppart, form, NULL);
  if(!result)
    result = Curl_mime_prepare_headers(&toppart, "multipart/form-data",
                                       NULL, MIMESTRATEGY_FORM);

  while(!result) {
    char buffer[8192];
    size_t nread = Curl_mime_read(buffer, 1, sizeof(buffer), &toppart);

    if(!nread)
      break;

    if(nread > sizeof(buffer) || append(arg, buffer, nread) != nread) {
      result = CURLE_READ_ERROR;
      if(nread == CURL_READFUNC_ABORT)
        result = CURLE_ABORTED_BY_CALLBACK;
    }
  }

  Curl_mime_cleanpart(&toppart);
  return (int) result;
}